

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int nh_http_parse_consume_header(http_context_t *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  nh_anchor_t nVar3;
  nh_anchor_t nVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  nh_kv_anchor_t *pnVar7;
  int value_offset;
  uint32_t value_index;
  int key_offset;
  uint32_t key_index;
  nh_stream_t *stream;
  http_context_t *ctx_local;
  
  if ((ctx->header).items == (nh_kv_anchor_t *)0x0) {
    pnVar7 = (nh_kv_anchor_t *)malloc(0x80);
    (ctx->header).items = pnVar7;
    (ctx->header).capacity = 8;
    (ctx->header).length = 0;
  }
  uVar1 = (ctx->raw).index;
  uVar5 = nh_stream_find_next_char_tuple(&ctx->raw,": ",0x80);
  if ((int)uVar5 < 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    (ctx->raw).index = uVar5 + 2 + (ctx->raw).index;
    uVar2 = (ctx->raw).index;
    uVar6 = nh_stream_find_next(&ctx->raw,'\r',0x400);
    if ((int)uVar6 < 1) {
      ctx_local._4_4_ = 0;
    }
    else {
      (ctx->raw).index = uVar6 + (ctx->raw).index;
      if ((ctx->header).length == (ctx->header).capacity) {
        (ctx->header).capacity = (ctx->header).capacity << 1;
        pnVar7 = (nh_kv_anchor_t *)realloc((ctx->header).items,(ulong)(ctx->header).capacity << 4);
        (ctx->header).items = pnVar7;
        if ((ctx->header).items == (nh_kv_anchor_t *)0x0) {
          __assert_fail("ctx->header.items != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                        ,0x21b,"int nh_http_parse_consume_header(http_context_t *)");
        }
      }
      pnVar7 = (ctx->header).items + (ctx->header).length;
      nVar3.len = uVar5;
      nVar3.index = uVar1;
      pnVar7->key = nVar3;
      nVar4.len = uVar6;
      nVar4.index = uVar2;
      pnVar7->value = nVar4;
      (ctx->header).length = (ctx->header).length + 1;
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int nh_http_parse_consume_header(http_context_t *ctx) {
    if (ctx->header.items == NULL) {
        ctx->header.items = (nh_kv_anchor_t *) malloc(sizeof(nh_kv_anchor_t) * REQUEST_HEADER_INIT_SIZE);
        ctx->header.capacity = REQUEST_HEADER_INIT_SIZE;
        ctx->header.length = 0;
    }

    nh_stream_t *stream = &ctx->raw;
    uint32_t key_index = stream->index;
    int key_offset;
    if ((key_offset = nh_stream_find_next_char_tuple(stream, ": ", 128)) < 0) return 0;

    stream->index += key_offset + 2;
    uint32_t value_index = stream->index;

    int value_offset;
    if ((value_offset = nh_stream_find_next(stream, '\r', 1024)) <= 0) return 0;

    stream->index += value_offset;

    if (ctx->header.length == ctx->header.capacity) {
        ctx->header.capacity *= 2;
        ctx->header.items = (nh_kv_anchor_t *) realloc(ctx->header.items,
                                                       ctx->header.capacity * sizeof(nh_kv_anchor_t));
        assert(ctx->header.items != NULL);
    }

    ctx->header.items[ctx->header.length] = (nh_kv_anchor_t) {
        .key = {.index = key_index, .len = key_offset},
        .value = {.index = value_index, .len = value_offset}
    };
    ctx->header.length++;
    return 1;
}